

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.hpp
# Opt level: O0

InstanceContext * __thiscall
vkt::SpirVAssembly::createInstanceContext<5ul>
          (InstanceContext *__return_storage_ptr__,SpirVAssembly *this,ShaderElement_0_ *elements,
          RGBA (*inputColors) [4],RGBA (*outputColors) [4],
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *testCodeFragments,StageToSpecConstantMap *specConstants,qpTestResult failResult,
          string *failMessageTemplate)

{
  mapped_type *this_00;
  ulong uVar1;
  undefined4 in_stack_00000014;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>
  local_80;
  ulong local_48;
  size_t i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  StageToSpecConstantMap *specConstants_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *testCodeFragments_local;
  RGBA (*outputColors_local) [4];
  RGBA (*inputColors_local) [4];
  ShaderElement_0_ *elements_local;
  InstanceContext *ctx;
  
  i._7_1_ = 0;
  local_38 = testCodeFragments;
  specConstants_local = (StageToSpecConstantMap *)outputColors;
  testCodeFragments_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)inputColors;
  outputColors_local = (RGBA (*) [4])elements;
  inputColors_local = (RGBA (*) [4])this;
  elements_local = (ShaderElement_0_ *)__return_storage_ptr__;
  InstanceContext::InstanceContext
            (__return_storage_ptr__,(RGBA (*) [4])elements,inputColors,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)outputColors,(StageToSpecConstantMap *)testCodeFragments);
  for (local_48 = 0; local_48 < 5; local_48 = local_48 + 1) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
              ::operator[](&__return_storage_ptr__->moduleMap,
                           (key_type *)((long)inputColors_local + local_48 * 0x48));
    std::make_pair<std::__cxx11::string_const&,vk::VkShaderStageFlagBits_const&>
              (&local_80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)inputColors_local + local_48 * 0x48 + 0x20),
               (VkShaderStageFlagBits *)((long)inputColors_local + local_48 * 0x48 + 0x40));
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>
    ::push_back(this_00,&local_80);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>
    ::~pair(&local_80);
    __return_storage_ptr__->requiredStages =
         __return_storage_ptr__->requiredStages |
         *(VkShaderStageFlagBits *)((long)inputColors_local + local_48 * 0x48 + 0x40);
  }
  __return_storage_ptr__->failResult = (qpTestResult)specConstants;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->failMessageTemplate,
               (string *)CONCAT44(in_stack_00000014,failResult));
  }
  return __return_storage_ptr__;
}

Assistant:

InstanceContext createInstanceContext (const ShaderElement							(&elements)[N],
									   const tcu::RGBA								(&inputColors)[4],
									   const tcu::RGBA								(&outputColors)[4],
									   const std::map<std::string, std::string>&	testCodeFragments,
									   const StageToSpecConstantMap&				specConstants,
									   const qpTestResult							failResult			= QP_TEST_RESULT_FAIL,
									   const std::string&							failMessageTemplate	= std::string())
{
	InstanceContext ctx (inputColors, outputColors, testCodeFragments, specConstants);
	for (size_t i = 0; i < N; ++i)
	{
		ctx.moduleMap[elements[i].moduleName].push_back(std::make_pair(elements[i].entryName, elements[i].stage));
		ctx.requiredStages = static_cast<vk::VkShaderStageFlagBits>(ctx.requiredStages | elements[i].stage);
	}
	ctx.failResult				= failResult;
	if (!failMessageTemplate.empty())
		ctx.failMessageTemplate	= failMessageTemplate;
	return ctx;
}